

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void NavierStokesBase::variableCleanUp(void)

{
  Projection *pPVar1;
  Projection *in_stack_00000180;
  MacProj *pMVar2;
  
  amrex::DescriptorList::clear((DescriptorList *)0x515bb0);
  amrex::DeriveList::clear((DeriveList *)0x515bbc);
  pPVar1 = projector;
  if (projector != (Projection *)0x0) {
    Projection::~Projection(in_stack_00000180);
    operator_delete(pPVar1,0x68);
  }
  projector = (Projection *)0x0;
  if (mac_projector != (MacProj *)0x0) {
    pMVar2 = mac_projector;
    MacProj::~MacProj(mac_projector);
    operator_delete(pMVar2,0x60);
  }
  mac_projector = (MacProj *)0x0;
  return;
}

Assistant:

void
NavierStokesBase::variableCleanUp ()
{
    desc_lst.clear();
    derive_lst.clear();

    delete projector;
    projector = nullptr;

    delete mac_projector;
    mac_projector = nullptr;

#ifdef AMREX_PARTICLES
    delete NSPC;
    NSPC = nullptr;
#endif
}